

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::centerOn(QGraphicsView *this,QPointF *pos)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  QGraphicsViewPrivate *pQVar5;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qint64 horizontal;
  qreal height;
  qreal width;
  QGraphicsViewPrivate *d;
  QPointF oldCenterPoint;
  QPointF viewPoint;
  QAbstractScrollArea *in_stack_ffffffffffffff90;
  int value;
  QAbstractSlider *in_stack_ffffffffffffffa8;
  long lVar6;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  QPointF local_18;
  long local_8;
  
  value = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa325ef);
  QAbstractScrollArea::viewport(in_stack_ffffffffffffff90);
  QWidget::width((QWidget *)0xa32606);
  QAbstractScrollArea::viewport(in_stack_ffffffffffffff90);
  QWidget::height((QWidget *)0xa32622);
  local_18.xp = -NAN;
  local_18.yp = -NAN;
  local_18.xp = (qreal)QTransform::map((QPointF *)&pQVar5->matrix);
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  if ((pQVar5->leftIndent == 0.0) && (!NAN(pQVar5->leftIndent))) {
    bVar3 = QWidget::isRightToLeft((QWidget *)0xa326be);
    if (bVar3) {
      lVar6 = 0;
      QAbstractScrollArea::horizontalScrollBar(in_stack_ffffffffffffff90);
      iVar4 = QAbstractSlider::minimum((QAbstractSlider *)in_stack_ffffffffffffff90);
      lVar6 = iVar4 + lVar6;
      QAbstractScrollArea::horizontalScrollBar(in_stack_ffffffffffffff90);
      iVar4 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff90);
      lVar6 = iVar4 + lVar6;
      QPointF::x(&local_18);
      iVar4 = qRound(5.28274800565859e-317);
      in_stack_ffffffffffffffa8 = (QAbstractSlider *)(lVar6 - iVar4);
      QAbstractScrollArea::horizontalScrollBar(in_stack_ffffffffffffff90);
      QAbstractSlider::setValue(in_stack_ffffffffffffffa8,value);
    }
    else {
      QAbstractScrollArea::horizontalScrollBar(in_stack_ffffffffffffff90);
      QPointF::x(&local_18);
      qRound(5.28279494189495e-317);
      QAbstractSlider::setValue(in_stack_ffffffffffffffa8,value);
    }
  }
  if ((pQVar5->topIndent == 0.0) && (!NAN(pQVar5->topIndent))) {
    QAbstractScrollArea::verticalScrollBar(in_stack_ffffffffffffff90);
    QPointF::y(&local_18);
    qRound(5.28283940780307e-317);
    QAbstractSlider::setValue(in_stack_ffffffffffffffa8,value);
  }
  local_28 = (undefined4)uVar1;
  uStack_24 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_20 = (undefined4)uVar2;
  uStack_1c = (undefined4)((ulong)uVar2 >> 0x20);
  *(undefined4 *)&(pQVar5->lastCenterPoint).xp = local_28;
  *(undefined4 *)((long)&(pQVar5->lastCenterPoint).xp + 4) = uStack_24;
  *(undefined4 *)&(pQVar5->lastCenterPoint).yp = uStack_20;
  *(undefined4 *)((long)&(pQVar5->lastCenterPoint).yp + 4) = uStack_1c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::centerOn(const QPointF &pos)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QPointF viewPoint = d->matrix.map(pos);
    QPointF oldCenterPoint = pos;

    if (!d->leftIndent) {
        if (isRightToLeft()) {
            qint64 horizontal = 0;
            horizontal += horizontalScrollBar()->minimum();
            horizontal += horizontalScrollBar()->maximum();
            horizontal -= qRound(viewPoint.x() - width / 2.0);
            horizontalScrollBar()->setValue(horizontal);
        } else {
            horizontalScrollBar()->setValue(qRound(viewPoint.x() - width / 2.0));
        }
    }
    if (!d->topIndent)
        verticalScrollBar()->setValue(qRound(viewPoint.y() - height / 2.0));
    d->lastCenterPoint = oldCenterPoint;
}